

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guard.h
# Opt level: O0

void __thiscall Guard::Guard(Guard *this,function<void_()> *enter,function<void_()> *leave)

{
  function<void_()> *in_RDI;
  function<void_()> *in_stack_ffffffffffffffd8;
  function<void_()> *in_stack_ffffffffffffffe0;
  
  std::function<void_()>::function(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::function<void_()>::operator()(in_RDI);
  return;
}

Assistant:

Guard(const std::function<void ()> &enter,
          const std::function<void ()> &leave)
    : leave_(leave)
    {
        enter();
    }